

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

void Aig_ManComputeSccs(Aig_Man_t *p)

{
  uint uVar1;
  int Entry;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *__ptr;
  uint *__ptr_00;
  void *pvVar6;
  long lVar7;
  int *__ptr_01;
  undefined8 *puVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  size_t __size;
  ulong uVar19;
  long lVar20;
  
  if (p->nRegs == 0) {
    puts("The network is combinational.");
    return;
  }
  __ptr = Aig_ManSupports(p);
  uVar1 = p->nRegs;
  uVar14 = (ulong)uVar1;
  __ptr_00 = (uint *)malloc(0x10);
  uVar12 = uVar1 - 1;
  uVar10 = 8;
  if (6 < uVar12) {
    uVar10 = uVar1;
  }
  *__ptr_00 = uVar10;
  if (uVar10 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar10 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar6;
  __ptr_00[1] = uVar1;
  memset(pvVar6,0,(long)(int)uVar1 << 3);
  iVar17 = __ptr->nSize;
  uVar19 = uVar14;
  if (0 < iVar17) {
    lVar7 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar7];
      iVar5 = *(int *)((long)pvVar2 + 4);
      if (iVar5 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      lVar20 = *(long *)((long)pvVar2 + 8);
      uVar15 = (ulong)(iVar5 - 1U);
      *(uint *)((long)pvVar2 + 4) = iVar5 - 1U;
      uVar10 = ((int)uVar19 - p->nObjs[3]) + *(int *)(lVar20 + uVar15 * 4);
      if (-1 < (int)uVar10) {
        uVar12 = 0;
        if (iVar5 != 1) {
          lVar16 = 0;
          uVar12 = 0;
          do {
            iVar17 = (p->nRegs - p->nObjs[2]) + *(int *)(lVar20 + lVar16 * 4);
            if (-1 < iVar17) {
              if (p->nRegs <= iVar17) {
                __assert_fail("iIn < Aig_ManRegNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                              ,0x206,"void Aig_ManComputeSccs(Aig_Man_t *)");
              }
              if (((int)uVar12 < 0) || ((uint)uVar15 <= uVar12)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar19 = (ulong)uVar12;
              uVar12 = uVar12 + 1;
              *(int *)(lVar20 + uVar19 * 4) = iVar17;
              uVar15 = (ulong)*(uint *)((long)pvVar2 + 4);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < (int)uVar15);
          if ((int)uVar15 < (int)uVar12) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
        }
        *(uint *)((long)pvVar2 + 4) = uVar12;
        uVar19 = (ulong)(uint)p->nRegs;
        if (p->nRegs <= (int)uVar10) {
          __assert_fail("iOut < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                        ,0x20b,"void Aig_ManComputeSccs(Aig_Man_t *)");
        }
        if ((int)uVar1 <= (int)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        *(void **)((long)pvVar6 + (ulong)uVar10 * 8) = pvVar2;
        iVar17 = __ptr->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar17);
    uVar12 = (int)uVar19 - 1;
  }
  __ptr_01 = (int *)malloc(0x10);
  uVar15 = 8;
  if (6 < uVar12) {
    uVar15 = uVar19;
  }
  __ptr_01[1] = 0;
  iVar17 = (int)uVar15;
  *__ptr_01 = iVar17;
  if (iVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)iVar17 << 3);
  }
  uVar11 = 0;
  *(void **)(__ptr_01 + 2) = pvVar6;
  if (0 < (int)uVar19) {
    __size = 0;
    uVar11 = 0;
    uVar3 = 0;
    do {
      uVar18 = uVar3;
      puVar8 = (undefined8 *)malloc(0x10);
      *puVar8 = 0x10;
      pvVar6 = malloc(0x40);
      puVar8[1] = pvVar6;
      iVar17 = (int)uVar18;
      if ((int)uVar11 == (int)uVar15) {
        pvVar6 = *(void **)(__ptr_01 + 2);
        if (uVar11 < 0x10) {
          if (pvVar6 == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(pvVar6,0x80);
          }
          *(void **)(__ptr_01 + 2) = pvVar6;
          uVar18 = 0x10;
        }
        else {
          if (pvVar6 == (void *)0x0) {
            pvVar6 = malloc(__size);
          }
          else {
            pvVar6 = realloc(pvVar6,__size);
          }
          *(void **)(__ptr_01 + 2) = pvVar6;
        }
      }
      else {
        pvVar6 = *(void **)(__ptr_01 + 2);
        uVar18 = uVar15;
      }
      *(undefined8 **)((long)pvVar6 + uVar11 * 8) = puVar8;
      uVar11 = uVar11 + 1;
      uVar19 = (ulong)(uint)p->nRegs;
      __size = __size + 0x10;
      uVar15 = uVar18;
      uVar3 = (ulong)(iVar17 + 2);
    } while ((int)uVar11 < p->nRegs);
    __ptr_01[1] = (int)uVar11;
    *__ptr_01 = (int)uVar18;
  }
  iVar17 = (int)uVar11;
  if (0 < (int)uVar1) {
    lVar7 = *(long *)(__ptr_00 + 2);
    uVar19 = 0;
    do {
      lVar20 = *(long *)(lVar7 + uVar19 * 8);
      if (0 < *(int *)(lVar20 + 4)) {
        lVar16 = 0;
        do {
          iVar5 = *(int *)(*(long *)(lVar20 + 8) + lVar16 * 4);
          if (((long)iVar5 < 0) || (iVar17 <= iVar5)) goto LAB_006d2250;
          Vec_IntPush(*(Vec_Int_t **)(*(long *)(__ptr_01 + 2) + (long)iVar5 * 8),(int)uVar19);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)(lVar20 + 4));
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar14);
    uVar19 = (ulong)(uint)p->nRegs;
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = (int)uVar19;
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar9;
  pvVar6 = calloc(1,(long)iVar5);
  do {
    p_00->nSize = 0;
    if ((int)uVar19 < 1) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      while (*(char *)((long)pvVar6 + uVar14) != '\0') {
        uVar14 = uVar14 + 1;
        if (uVar19 == uVar14) goto LAB_006d215b;
      }
    }
    if ((int)uVar14 == (int)uVar19) goto LAB_006d2156;
    *(undefined1 *)((long)pvVar6 + (uVar14 & 0xffffffff)) = 1;
    Vec_IntPush(p_00,(int)uVar14);
    iVar5 = p_00->nSize;
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        iVar5 = p_00->pArray[lVar7];
        lVar20 = (long)iVar5;
        if ((lVar20 < 0) || ((int)uVar1 <= iVar5)) {
LAB_006d2250:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar16 = *(long *)(*(long *)(__ptr_00 + 2) + lVar20 * 8);
        iVar4 = *(int *)(lVar16 + 4);
        if (0 < iVar4) {
          lVar13 = 0;
          do {
            Entry = *(int *)(*(long *)(lVar16 + 8) + lVar13 * 4);
            if (*(char *)((long)pvVar6 + (long)Entry) == '\0') {
              *(undefined1 *)((long)pvVar6 + (long)Entry) = 1;
              Vec_IntPush(p_00,Entry);
              iVar4 = *(int *)(lVar16 + 4);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < iVar4);
        }
        if (iVar17 <= iVar5) goto LAB_006d2250;
        lVar20 = *(long *)(*(long *)(__ptr_01 + 2) + lVar20 * 8);
        iVar5 = *(int *)(lVar20 + 4);
        if (0 < iVar5) {
          lVar16 = 0;
          do {
            iVar4 = *(int *)(*(long *)(lVar20 + 8) + lVar16 * 4);
            if (*(char *)((long)pvVar6 + (long)iVar4) == '\0') {
              *(undefined1 *)((long)pvVar6 + (long)iVar4) = 1;
              Vec_IntPush(p_00,iVar4);
              iVar5 = *(int *)(lVar20 + 4);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < iVar5);
        }
        lVar7 = lVar7 + 1;
        iVar5 = p_00->nSize;
      } while (lVar7 < iVar5);
    }
    if (iVar5 == p->nRegs) break;
    printf("SCC #%d contains %5d registers.\n");
    uVar19 = (ulong)(uint)p->nRegs;
  } while( true );
  puts("There is only one SCC of registers in this network.");
LAB_006d2156:
  if (pvVar6 != (void *)0x0) {
LAB_006d215b:
    free(pvVar6);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  pvVar6 = *(void **)(__ptr_01 + 2);
  if (iVar17 < 1) {
    if (pvVar6 == (void *)0x0) goto LAB_006d21e7;
  }
  else {
    uVar14 = 0;
    do {
      pvVar2 = *(void **)((long)pvVar6 + uVar14 * 8);
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
      }
      uVar14 = uVar14 + 1;
    } while ((uVar11 & 0xffffffff) != uVar14);
  }
  free(pvVar6);
LAB_006d21e7:
  free(__ptr_01);
  iVar17 = __ptr->nSize;
  if (0 < iVar17) {
    lVar7 = 0;
    do {
      pvVar6 = __ptr->pArray[lVar7];
      if (pvVar6 != (void *)0x0) {
        if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar6 + 8));
        }
        free(pvVar6);
        iVar17 = __ptr->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar17);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Aig_ManComputeSccs( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix, * vMatrix2;
    Vec_Int_t * vSupp, * vSupp2, * vComp;
    char * pVarsTot;
    int i, k, m, iOut, iIn, nComps;
    if ( Aig_ManRegNum(p) == 0 )
    {
        printf( "The network is combinational.\n" );
        return;
    }
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
            continue;
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    // create the reverse matrix
    vMatrix2 = Vec_PtrAlloc( Aig_ManRegNum(p) );
    for ( i = 0; i < Aig_ManRegNum(p); i++ )
        Vec_PtrPush( vMatrix2, Vec_IntAlloc(8) );
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
    {
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iIn );
            Vec_IntPush( vSupp2, i );
        }
    } 

    // detect strongly connected components
    vComp = Vec_IntAlloc( Aig_ManRegNum(p) );
    pVarsTot = ABC_ALLOC( char, Aig_ManRegNum(p) );
    memset( pVarsTot, 0, Aig_ManRegNum(p) * sizeof(char) );
    for ( nComps = 0; ; nComps++ )
    {
        Vec_IntClear( vComp );
        // get the first support
        for ( iOut = 0; iOut < Aig_ManRegNum(p); iOut++ )
            if ( pVarsTot[iOut] == 0 )
                break;
        if ( iOut == Aig_ManRegNum(p) )
            break;
        pVarsTot[iOut] = 1;
        Vec_IntPush( vComp, iOut );
        Vec_IntForEachEntry( vComp, iOut, i )
        {
            vSupp = (Vec_Int_t *)Vec_PtrEntry( vMatrix, iOut );
            Vec_IntForEachEntry( vSupp, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iOut );
            Vec_IntForEachEntry( vSupp2, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
        }
        if ( Vec_IntSize(vComp) == Aig_ManRegNum(p) )
        {
            printf( "There is only one SCC of registers in this network.\n" );
            break;
        }
        printf( "SCC #%d contains %5d registers.\n", nComps+1, Vec_IntSize(vComp) );
    }
    ABC_FREE( pVarsTot );
    Vec_IntFree( vComp );
    Vec_PtrFree( vMatrix );
    Vec_VecFree( (Vec_Vec_t *)vMatrix2 );
    Vec_VecFree( (Vec_Vec_t *)vSupports );
}